

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Data.cpp
# Opt level: O3

bool __thiscall SRUP_MSG_DATA::data(SRUP_MSG_DATA *this,int32_t data)

{
  int32_t *piVar1;
  
  (this->super_SRUP_MSG).m_is_serialized = false;
  if (this->m_data != (uint8_t *)0x0) {
    operator_delete__(this->m_data);
  }
  piVar1 = (int32_t *)operator_new__(4);
  this->m_data = (uint8_t *)piVar1;
  *piVar1 = data;
  this->m_data_len = 4;
  return true;
}

Assistant:

bool SRUP_MSG_DATA::data(const int32_t data)
{
    m_is_serialized = false;
    const uint8_t len = 4;

    delete[] m_data;

    m_data = new uint8_t[len];
    std::memcpy(m_data, &data, len);
    m_data_len = len;
    return true;
}